

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall Socket::Poll::Private::set(Private *this,Socket *socket,uint events)

{
  uint *puVar1;
  code *pcVar2;
  int iVar3;
  Iterator IVar4;
  SocketInfo *pSVar5;
  uint uVar6;
  uint uVar7;
  Iterator it;
  epoll_event ev;
  
  ev._0_8_ = socket;
  IVar4 = HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::find(&this->sockets,(Socket **)&ev);
  if (IVar4.item == (this->sockets)._end.item) {
    iVar3 = socket->s;
    if (iVar3 != -1) {
      ev.events = 0;
      ev.data.fd = 0;
      ev.data.u64._4_4_ = 0;
      it.item = (Item *)socket;
      pSVar5 = HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::append
                         (&this->sockets,(Socket **)&it,(SocketInfo *)&ev);
      pSVar5->s = iVar3;
      pSVar5->socket = socket;
      uVar7 = 0x2011;
      if ((events & 5) == 0) {
        uVar7 = 0;
      }
      ev.events = uVar7 | 0x2014;
      if ((events & 10) == 0) {
        ev.events = uVar7;
      }
      pSVar5->events = events;
      ev.data.fd = (int)pSVar5;
      ev.data.u64._4_4_ = (undefined4)((ulong)pSVar5 >> 0x20);
      iVar3 = epoll_ctl(this->fd,1,iVar3,(epoll_event *)&ev);
      if (iVar3 != 0) {
        iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Socket/Socket.cpp"
                              ,0x4d1,"epoll_ctl(fd, EPOLL_CTL_ADD, s, &ev) == 0");
        if (iVar3 != 0) goto LAB_0010f036;
      }
    }
  }
  else {
    uVar7 = ((IVar4.item)->value).events;
    if (uVar7 != events) {
      ((IVar4.item)->value).events = events;
      uVar6 = 0x2011;
      if ((events & 5) == 0) {
        uVar6 = 0;
      }
      ev.events = uVar6 | 0x2014;
      if ((events & 10) == 0) {
        ev.events = uVar6;
      }
      ev.data = (epoll_data_t)&(IVar4.item)->value;
      iVar3 = epoll_ctl(this->fd,3,socket->s,(epoll_event *)&ev);
      if (iVar3 != 0) {
        iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Socket/Socket.cpp"
                              ,0x4bc,"epoll_ctl(fd, EPOLL_CTL_MOD, socket.s, &ev) == 0");
        if (iVar3 != 0) {
LAB_0010f036:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
      }
      it = HashMap<Socket_*,_unsigned_int>::find
                     (&this->selectedSockets,&((IVar4.item)->value).socket);
      if (it.item != (this->selectedSockets)._end.item) {
        puVar1 = &(it.item)->value;
        *puVar1 = *puVar1 & (~uVar7 | events);
        if (*puVar1 == 0) {
          HashMap<Socket_*,_unsigned_int>::remove(&this->selectedSockets,(char *)&it);
        }
      }
    }
  }
  return;
}

Assistant:

void Socket::Poll::Private::set(Socket& socket, uint events)
{
  epoll_event ev;
  HashMap<Socket*, Private::SocketInfo>::Iterator it = sockets.find(&socket);
  if(it != sockets.end())
  {
    Private::SocketInfo& sockInfo = *it;
    if(sockInfo.events == events)
      return;
    uint removedEvents = sockInfo.events & ~events;
    sockInfo.events = events;
    ev.events = mapEvents(events);
    ev.data.ptr = &sockInfo;
    VERIFY(epoll_ctl(fd, EPOLL_CTL_MOD, socket.s, &ev) == 0);
    HashMap<Socket*, uint>::Iterator it = selectedSockets.find(sockInfo.socket);
    if(it != selectedSockets.end())
    {
      uint& selectedEvents = *it;
      selectedEvents &= ~removedEvents;
      if(selectedEvents == 0)
        selectedSockets.remove(it);
    }
  }
  else
  {
    SOCKET s = socket.s;
    if(s == INVALID_SOCKET)
      return;
    Private::SocketInfo& sockInfo = sockets.append(&socket, Private::SocketInfo());
    sockInfo.s = s;
    sockInfo.socket = &socket;
    sockInfo.events = events;
    ev.events = mapEvents(events);
    ev.data.ptr = &sockInfo;
    VERIFY(epoll_ctl(fd, EPOLL_CTL_ADD, s, &ev) == 0);
  }
}